

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O3

void __thiscall
icu_63::SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder
          (SimpleFilteredBreakIteratorBuilder *this,Locale *fromLocale,UErrorCode *status)

{
  char *localeID;
  UResourceBundle *resB;
  UChar *pUVar1;
  UResourceBundle *p;
  LocalPointerBase<UResourceBundle> fillIn;
  UErrorCode subStatus;
  int32_t len;
  LocalUResourceBundlePointer breaks;
  LocalUResourceBundlePointer exceptions;
  LocalUResourceBundlePointer b;
  UnicodeString str;
  UErrorCode local_b4;
  LocalPointerBase<UResourceBundle> local_b0;
  int32_t local_a4;
  LocalPointerBase<UResourceBundle> local_a0;
  ConstChar16Ptr local_98;
  LocalPointerBase<UResourceBundle> local_90;
  LocalPointerBase<UResourceBundle> local_88;
  UChar *local_80;
  UnicodeString local_70;
  
  (this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleFilteredBreakIteratorBuilder_003aaa38;
  UVector::UVector(&(this->fSet).super_UVector,uprv_deleteUObject_63,uhash_compareUnicodeString_63,1
                   ,status);
  (this->fSet).super_UVector.super_UObject._vptr_UObject = (_func_int **)&PTR__UStringSet_003aaab8;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_b4 = U_ZERO_ERROR;
    localeID = Locale::getBaseName(fromLocale);
    local_88.ptr = ures_open_63("icudt63l-brkitr",localeID,&local_b4);
    if (local_b4 < U_ILLEGAL_ARGUMENT_ERROR && local_b4 != U_USING_DEFAULT_WARNING) {
      local_90.ptr = ures_getByKeyWithFallback_63
                               (local_88.ptr,"exceptions",(UResourceBundle *)0x0,&local_b4);
      if (local_b4 < U_ILLEGAL_ARGUMENT_ERROR && local_b4 != U_USING_DEFAULT_WARNING) {
        local_a0.ptr = ures_getByKeyWithFallback_63
                                 (local_90.ptr,"SentenceBreak",(UResourceBundle *)0x0,&local_b4);
        if (local_b4 < U_ILLEGAL_ARGUMENT_ERROR && local_b4 != U_USING_DEFAULT_WARNING) {
          local_b4 = *status;
          fillIn.ptr = (UResourceBundle *)0x0;
          do {
            local_b0.ptr = (UResourceBundle *)0x0;
            resB = ures_getNextResource_63(local_a0.ptr,fillIn.ptr,&local_b4);
            if (local_b0.ptr != (UResourceBundle *)0x0) {
              ures_close_63(local_b0.ptr);
            }
            local_b0.ptr = resB;
            if (local_b4 < U_ILLEGAL_ARGUMENT_ERROR && resB != (UResourceBundle *)0x0) {
              local_70.super_Replaceable.super_UObject._vptr_UObject =
                   (UObject)&PTR__UnicodeString_003b2258;
              local_70.fUnion.fStackFields.fLengthAndFlags = 2;
              local_a4 = 0;
              pUVar1 = ures_getString_63(resB,&local_a4,status);
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                local_98.p_ = pUVar1;
                UnicodeString::setTo(&local_70,'\x01',&local_98,local_a4);
                local_80 = local_98.p_;
              }
              else {
                UnicodeString::setToBogus(&local_70);
              }
              (*(this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject[3])
                        (this,&local_70,status);
              UnicodeString::~UnicodeString(&local_70);
            }
          } while ((local_b0.ptr != (UResourceBundle *)0x0) &&
                  (fillIn.ptr = local_b0.ptr, local_b4 < U_ILLEGAL_ARGUMENT_ERROR));
          if ((U_ZERO_ERROR < local_b4) &&
             ((local_b4 != U_INDEX_OUTOFBOUNDS_ERROR && (*status < U_ILLEGAL_ARGUMENT_ERROR)))) {
            *status = local_b4;
          }
          LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                    ((LocalUResourceBundlePointer *)&local_b0);
        }
        else {
          *status = local_b4;
        }
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&local_a0);
      }
      else {
        *status = local_b4;
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&local_90);
    }
    else {
      *status = local_b4;
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&local_88);
  }
  return;
}

Assistant:

SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder(const Locale &fromLocale, UErrorCode &status)
  : fSet(status)
{
  if(U_SUCCESS(status)) {
    UErrorCode subStatus = U_ZERO_ERROR;
    LocalUResourceBundlePointer b(ures_open(U_ICUDATA_BRKITR, fromLocale.getBaseName(), &subStatus));
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open BUNDLE %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }
    LocalUResourceBundlePointer exceptions(ures_getByKeyWithFallback(b.getAlias(), "exceptions", NULL, &subStatus));
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open EXCEPTIONS %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }
    LocalUResourceBundlePointer breaks(ures_getByKeyWithFallback(exceptions.getAlias(), "SentenceBreak", NULL, &subStatus));

#if FB_DEBUG
    {
      UErrorCode subsub = subStatus;
      fprintf(stderr, "open SentenceBreak %s => %s, %s\n", fromLocale.getBaseName(), ures_getLocale(breaks.getAlias(), &subsub), u_errorName(subStatus));
    }
#endif
    
    if (U_FAILURE(subStatus) || (subStatus == U_USING_DEFAULT_WARNING) ) {    
      status = subStatus; // copy the failing status 
#if FB_DEBUG
      fprintf(stderr, "open %s : %s, %s\n", fromLocale.getBaseName(), "[exit]", u_errorName(status));
#endif
      return;  // leaves the builder empty, if you try to use it.
    }

    LocalUResourceBundlePointer strs;
    subStatus = status; // Pick up inherited warning status now 
    do {
      strs.adoptInstead(ures_getNextResource(breaks.getAlias(), strs.orphan(), &subStatus));
      if(strs.isValid() && U_SUCCESS(subStatus)) {
        UnicodeString str(ures_getUnicodeString(strs.getAlias(), &status));
        suppressBreakAfter(str, status); // load the string
      }
    } while (strs.isValid() && U_SUCCESS(subStatus));
    if(U_FAILURE(subStatus)&&subStatus!=U_INDEX_OUTOFBOUNDS_ERROR&&U_SUCCESS(status)) {
      status = subStatus;
    }
  }
}